

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O0

int mbedtls_net_bind(mbedtls_net_context *ctx,char *bind_ip,char *port,int proto)

{
  int iVar1;
  addrinfo *local_78;
  addrinfo *cur;
  addrinfo *addr_list;
  addrinfo hints;
  undefined4 local_30;
  int ret;
  int n;
  int proto_local;
  char *port_local;
  char *bind_ip_local;
  mbedtls_net_context *ctx_local;
  
  ret = proto;
  _n = port;
  port_local = bind_ip;
  bind_ip_local = (char *)ctx;
  hints.ai_next._4_4_ = net_prepare();
  ctx_local._4_4_ = hints.ai_next._4_4_;
  if (hints.ai_next._4_4_ == 0) {
    memset(&addr_list,0,0x30);
    addr_list._4_4_ = 0;
    hints.ai_flags = 1;
    if (ret == 1) {
      hints.ai_flags = 2;
    }
    hints.ai_family = 6;
    if (ret == 1) {
      hints.ai_family = 0x11;
    }
    if (port_local == (char *)0x0) {
      addr_list._0_4_ = 1;
    }
    iVar1 = getaddrinfo(port_local,_n,(addrinfo *)&addr_list,(addrinfo **)&cur);
    if (iVar1 == 0) {
      hints.ai_next._4_4_ = -0x52;
      for (local_78 = cur; local_78 != (addrinfo *)0x0; local_78 = local_78->ai_next) {
        iVar1 = socket(local_78->ai_family,local_78->ai_socktype,local_78->ai_protocol);
        *(int *)bind_ip_local = iVar1;
        if (*(int *)bind_ip_local < 0) {
          hints.ai_next._4_4_ = -0x42;
        }
        else {
          local_30 = 1;
          iVar1 = setsockopt(*(int *)bind_ip_local,1,2,&local_30,4);
          if (iVar1 == 0) {
            iVar1 = bind(*(int *)bind_ip_local,(sockaddr *)local_78->ai_addr,local_78->ai_addrlen);
            if (iVar1 == 0) {
              if ((ret != 0) || (iVar1 = listen(*(int *)bind_ip_local,10), iVar1 == 0)) {
                hints.ai_next._4_4_ = 0;
                break;
              }
              close(*(int *)bind_ip_local);
              hints.ai_next._4_4_ = -0x48;
            }
            else {
              close(*(int *)bind_ip_local);
              hints.ai_next._4_4_ = -0x46;
            }
          }
          else {
            close(*(int *)bind_ip_local);
            hints.ai_next._4_4_ = -0x42;
          }
        }
      }
      freeaddrinfo((addrinfo *)cur);
      ctx_local._4_4_ = hints.ai_next._4_4_;
    }
    else {
      ctx_local._4_4_ = -0x52;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_net_bind( mbedtls_net_context *ctx, const char *bind_ip, const char *port, int proto )
{
    int n, ret;
    struct addrinfo hints, *addr_list, *cur;

    if( ( ret = net_prepare() ) != 0 )
        return( ret );

    /* Bind to IPv6 and/or IPv4, but only in the desired protocol */
    memset( &hints, 0, sizeof( hints ) );
    hints.ai_family = AF_UNSPEC;
    hints.ai_socktype = proto == MBEDTLS_NET_PROTO_UDP ? SOCK_DGRAM : SOCK_STREAM;
    hints.ai_protocol = proto == MBEDTLS_NET_PROTO_UDP ? IPPROTO_UDP : IPPROTO_TCP;
    if( bind_ip == NULL )
        hints.ai_flags = AI_PASSIVE;

    if( getaddrinfo( bind_ip, port, &hints, &addr_list ) != 0 )
        return( MBEDTLS_ERR_NET_UNKNOWN_HOST );

    /* Try the sockaddrs until a binding succeeds */
    ret = MBEDTLS_ERR_NET_UNKNOWN_HOST;
    for( cur = addr_list; cur != NULL; cur = cur->ai_next )
    {
        ctx->fd = (int) socket( cur->ai_family, cur->ai_socktype,
                            cur->ai_protocol );
        if( ctx->fd < 0 )
        {
            ret = MBEDTLS_ERR_NET_SOCKET_FAILED;
            continue;
        }

        n = 1;
        if( setsockopt( ctx->fd, SOL_SOCKET, SO_REUSEADDR,
                        (const char *) &n, sizeof( n ) ) != 0 )
        {
            close( ctx->fd );
            ret = MBEDTLS_ERR_NET_SOCKET_FAILED;
            continue;
        }

        if( bind( ctx->fd, cur->ai_addr, MSVC_INT_CAST cur->ai_addrlen ) != 0 )
        {
            close( ctx->fd );
            ret = MBEDTLS_ERR_NET_BIND_FAILED;
            continue;
        }

        /* Listen only makes sense for TCP */
        if( proto == MBEDTLS_NET_PROTO_TCP )
        {
            if( listen( ctx->fd, MBEDTLS_NET_LISTEN_BACKLOG ) != 0 )
            {
                close( ctx->fd );
                ret = MBEDTLS_ERR_NET_LISTEN_FAILED;
                continue;
            }
        }

        /* I we ever get there, it's a success */
        ret = 0;
        break;
    }

    freeaddrinfo( addr_list );

    return( ret );

}